

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

bool __thiscall QWidgetLineControl::fixup(QWidgetLineControl *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  int cursorCopy;
  int local_44;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)(this + 0xa8) != 0) &&
     (plVar4 = *(long **)(this + 0xb0),
     plVar4 != (long *)0x0 && *(int *)(*(long *)(this + 0xa8) + 4) != 0)) {
    local_40.d.d = *(Data **)(this + 0x18);
    local_40.d.ptr = *(char16_t **)(this + 0x20);
    local_40.d.size = *(qsizetype *)(this + 0x28);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      plVar4 = *(long **)(this + 0xb0);
    }
    local_44 = *(int *)(this + 0x40);
    (**(code **)(*plVar4 + 0x68))(plVar4,&local_40);
    iVar3 = (**(code **)(**(long **)(this + 0xb0) + 0x60))
                      (*(long **)(this + 0xb0),&local_40,&local_44);
    if ((iVar3 == 2) &&
       (((local_40.d.size != *(long *)(this + 0x28) ||
         (QVar5.m_data = local_40.d.ptr, QVar5.m_size = local_40.d.size,
         QVar6.m_data = *(storage_type_conflict **)(this + 0x20), QVar6.m_size = local_40.d.size,
         cVar1 = QtPrivate::equalStrings(QVar5,QVar6), cVar1 == '\0')) ||
        (local_44 != *(int *)(this + 0x40))))) {
      internalSetText(this,&local_40,local_44,false);
    }
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar2 = true;
    if (iVar3 == 2) goto LAB_00424022;
  }
  bVar2 = false;
LAB_00424022:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QWidgetLineControl::fixup() // this function assumes that validate currently returns != Acceptable
{
#ifndef QT_NO_VALIDATOR
    if (m_validator) {
        QString textCopy = m_text;
        int cursorCopy = m_cursor;
        m_validator->fixup(textCopy);
        if (m_validator->validate(textCopy, cursorCopy) == QValidator::Acceptable) {
            if (textCopy != m_text || cursorCopy != m_cursor)
                internalSetText(textCopy, cursorCopy, false);
            return true;
        }
    }
#endif
    return false;
}